

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkPrintNodeArray(Wlc_Ntk_t *p,Vec_Int_t *vArray)

{
  int Id;
  Wlc_Obj_t *pObj;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vArray->nSize; i_00 = i_00 + 1) {
    Id = Vec_IntEntry(vArray,i_00);
    pObj = Wlc_NtkObj(p,Id);
    Wlc_NtkPrintNode(p,pObj);
  }
  return;
}

Assistant:

void Wlc_NtkPrintNodeArray( Wlc_Ntk_t * p, Vec_Int_t * vArray )
{
    Wlc_Obj_t * pObj; 
    int i;
    Wlc_NtkForEachObjVec( vArray, p, pObj, i )
        Wlc_NtkPrintNode( p, pObj );
}